

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O0

int readMPS_dense(char *filename,int mxNumRow,int mxNumCol,int *numRow,int *numCol,int *objSense,
                 double *objOffset,vector<double,_std::allocator<double>_> *A_cw,
                 vector<double,_std::allocator<double>_> *rhs,
                 vector<double,_std::allocator<double>_> *cost,
                 vector<double,_std::allocator<double>_> *lb,
                 vector<double,_std::allocator<double>_> *ub,
                 vector<int,_std::allocator<int>_> *integerColumn)

{
  value_type vVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  uint *in_RCX;
  uint *in_R8;
  uint *in_R9;
  int *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  int *in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000024;
  char *in_stack_00000028;
  double *in_stack_00000070;
  double r_v;
  vector<int,_std::allocator<int>_> *in_stack_00000080;
  int r_n;
  int el_n;
  int c_n;
  vector<double,_std::allocator<double>_> *in_stack_00000090;
  vector<double,_std::allocator<double>_> *in_stack_00000098;
  vector<double,_std::allocator<double>_> *in_stack_000000a0;
  vector<double,_std::allocator<double>_> *in_stack_000000a8;
  int rtCd;
  vector<double,_std::allocator<double>_> Avalue;
  vector<int,_std::allocator<int>_> Aindex;
  vector<int,_std::allocator<int>_> Astart;
  int *__n;
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  int local_d0;
  int local_cc;
  vector<double,_std::allocator<double>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  uint *local_60;
  uint *local_58;
  uint *local_50;
  int local_34;
  
  this = &local_78;
  local_60 = in_R9;
  local_58 = in_R8;
  local_50 = in_RCX;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c5a19);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c5a29);
  this_00 = &local_a8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c5a39);
  __n = in_stack_00000008;
  local_34 = readMPS_sparse(in_stack_00000028,in_stack_00000024,in_stack_00000020,in_stack_00000018,
                            (int *)in_stack_00000010,in_stack_00000008,in_stack_00000070,
                            (vector<int,_std::allocator<int>_> *)r_v,in_stack_00000080,_el_n,
                            in_stack_00000090,in_stack_00000098,in_stack_000000a0,in_stack_000000a8,
                            (vector<int,_std::allocator<int>_> *)
                            Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
  if (local_34 == 0) {
    printf("readMPS_dense: Model has %d rows and %d columns\n",(ulong)*local_50,(ulong)*local_58);
    printf("readMPS_dense: Objective sense is %d; Objective offset is %g\n",
           *(undefined8 *)in_stack_00000008,(ulong)*local_60);
    std::vector<double,_std::allocator<double>_>::assign
              (this,(size_type)__n,(value_type_conflict1 *)0x1c5bd4);
    for (local_cc = 0; local_cc < (int)*local_58; local_cc = local_cc + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&local_78,(long)local_cc);
      for (local_d0 = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&local_78,(long)(local_cc + 1)),
          local_d0 < *pvVar3; local_d0 = local_d0 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_90,(long)local_d0);
        iVar2 = *pvVar3;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_a8,(long)local_d0);
        vVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_00000010,(long)(int)(iVar2 + local_cc * *local_50));
        *pvVar4 = vVar1;
      }
    }
    local_34 = 0;
  }
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return local_34;
}

Assistant:

int readMPS_dense(const char *filename, int mxNumRow, int mxNumCol, 
		  int& numRow, int& numCol, int& objSense, double& objOffset,
		  vector<double>& A_cw,
		  vector<double>& rhs, vector<double>& cost, vector<double>& lb, vector<double>& ub,
		  vector<int>& integerColumn) {
  vector<int> Astart;
  vector<int> Aindex;
  vector<double> Avalue;
  int rtCd = readMPS_sparse(filename, mxNumRow, mxNumCol,
			    numRow, numCol, objSense, objOffset,
			    Astart, Aindex, Avalue,
			    rhs, cost, lb, ub,
			    integerColumn);
  if (rtCd) return rtCd;
#ifdef JAJH_dev
  printf("readMPS_dense: Model has %d rows and %d columns\n", numRow, numCol);
  printf("readMPS_dense: Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
#endif
  A_cw.assign(numCol*numRow,0);
  for (int c_n = 0; c_n<numCol; c_n++) {
    for (int el_n = Astart[c_n]; el_n < Astart[c_n+1]; el_n++) {
      int r_n = Aindex[el_n];
      double r_v = Avalue[el_n];
      A_cw[r_n+c_n*numRow] = r_v;
    }
  }
  return 0;
}